

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3SelectDoctotal(Fts3Table *pTab,sqlite3_stmt **ppStmt)

{
  int iVar1;
  int local_24;
  sqlite3_stmt *psStack_20;
  int rc;
  sqlite3_stmt *pStmt;
  sqlite3_stmt **ppStmt_local;
  Fts3Table *pTab_local;
  
  psStack_20 = (sqlite3_stmt *)0x0;
  pStmt = (sqlite3_stmt *)ppStmt;
  ppStmt_local = (sqlite3_stmt **)pTab;
  local_24 = fts3SqlStmt(pTab,0x16,&stack0xffffffffffffffe0,(sqlite3_value **)0x0);
  if (local_24 == 0) {
    sqlite3_bind_int(psStack_20,1,0);
    iVar1 = sqlite3_step(psStack_20);
    if ((iVar1 != 100) || (iVar1 = sqlite3_column_type(psStack_20,0), iVar1 != 4)) {
      local_24 = sqlite3_reset(psStack_20);
      if (local_24 == 0) {
        local_24 = 0x10b;
      }
      psStack_20 = (sqlite3_stmt *)0x0;
    }
  }
  *(sqlite3_stmt **)pStmt = psStack_20;
  return local_24;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SelectDoctotal(
  Fts3Table *pTab,                /* Fts3 table handle */
  sqlite3_stmt **ppStmt           /* OUT: Statement handle */
){
  sqlite3_stmt *pStmt = 0;
  int rc;
  rc = fts3SqlStmt(pTab, SQL_SELECT_STAT, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
    if( sqlite3_step(pStmt)!=SQLITE_ROW
     || sqlite3_column_type(pStmt, 0)!=SQLITE_BLOB
    ){
      rc = sqlite3_reset(pStmt);
      if( rc==SQLITE_OK ) rc = FTS_CORRUPT_VTAB;
      pStmt = 0;
    }
  }
  *ppStmt = pStmt;
  return rc;
}